

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  
  if (req_comp != img_n) {
    uVar6 = (ulong)y;
    puVar4 = (uchar *)malloc((ulong)(x * req_comp * y));
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      data = (uchar *)0x0;
    }
    else {
      iVar14 = req_comp + img_n * 8;
      uVar5 = 0;
      if ((int)y < 1) {
        uVar6 = 0;
      }
      iVar3 = x - 1;
      uVar12 = 0;
      for (uVar13 = 0; uVar13 != uVar6; uVar13 = uVar13 + 1) {
        if (iVar14 - 10U < 0x1a) {
          uVar11 = (ulong)uVar5;
          iVar7 = (int)uVar13 * x;
          pbVar10 = data + (uint)(iVar7 * img_n);
          pbVar8 = puVar4 + (uint)(iVar7 * req_comp);
          switch(iVar14) {
          case 10:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              puVar4[lVar9 * 2 + uVar11] = data[lVar9 + uVar12];
              puVar4[lVar9 * 2 + uVar11 + 1] = 0xff;
              lVar9 = lVar9 + 1;
            }
            break;
          case 0xb:
            pbVar8 = puVar4 + uVar11 + 2;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              bVar2 = *pbVar10;
              *pbVar8 = bVar2;
              pbVar8[-1] = bVar2;
              pbVar8[-2] = bVar2;
              pbVar10 = pbVar10 + 1;
              pbVar8 = pbVar8 + 3;
            }
            break;
          case 0xc:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              uVar1 = data[lVar9 + uVar12];
              puVar4[lVar9 * 4 + uVar11 + 2] = uVar1;
              puVar4[lVar9 * 4 + uVar11 + 1] = uVar1;
              puVar4[lVar9 * 4 + uVar11] = uVar1;
              puVar4[lVar9 * 4 + uVar11 + 3] = 0xff;
              lVar9 = lVar9 + 1;
            }
            break;
          case 0x11:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              puVar4[lVar9 + uVar11] = data[lVar9 * 2 + uVar12];
              lVar9 = lVar9 + 1;
            }
            break;
          case 0x13:
            pbVar8 = puVar4 + uVar11 + 2;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              bVar2 = *pbVar10;
              *pbVar8 = bVar2;
              pbVar8[-1] = bVar2;
              pbVar8[-2] = bVar2;
              pbVar10 = pbVar10 + 2;
              pbVar8 = pbVar8 + 3;
            }
            break;
          case 0x14:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              uVar1 = data[lVar9 + uVar12];
              puVar4[lVar9 * 2 + uVar11 + 2] = uVar1;
              puVar4[lVar9 * 2 + uVar11 + 1] = uVar1;
              puVar4[lVar9 * 2 + uVar11] = uVar1;
              puVar4[lVar9 * 2 + uVar11 + 3] = data[lVar9 + uVar12 + 1];
              lVar9 = lVar9 + 2;
            }
            break;
          case 0x19:
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              *pbVar8 = (byte)((uint)pbVar10[2] * 0x1d +
                               (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
              pbVar10 = pbVar10 + 3;
              pbVar8 = pbVar8 + 1;
            }
            break;
          case 0x1a:
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              *pbVar8 = (byte)((uint)pbVar10[2] * 0x1d +
                               (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
              pbVar8[1] = 0xff;
              pbVar10 = pbVar10 + 3;
              pbVar8 = pbVar8 + 2;
            }
            break;
          case 0x1c:
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              *pbVar8 = *pbVar10;
              pbVar8[1] = pbVar10[1];
              pbVar8[2] = pbVar10[2];
              pbVar8[3] = 0xff;
              pbVar10 = pbVar10 + 3;
              pbVar8 = pbVar8 + 4;
            }
            break;
          case 0x21:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              puVar4[lVar9 + uVar11] =
                   (uchar)((uint)data[lVar9 * 4 + uVar12 + 2] * 0x1d +
                           (uint)data[lVar9 * 4 + uVar12 + 1] * 0x96 +
                           (uint)data[lVar9 * 4 + uVar12] * 0x4d >> 8);
              lVar9 = lVar9 + 1;
            }
            break;
          case 0x22:
            lVar9 = 0;
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              puVar4[lVar9 + uVar11] =
                   (uchar)((uint)data[lVar9 * 2 + uVar12 + 2] * 0x1d +
                           (uint)data[lVar9 * 2 + uVar12 + 1] * 0x96 +
                           (uint)data[lVar9 * 2 + uVar12] * 0x4d >> 8);
              puVar4[lVar9 + uVar11 + 1] = data[lVar9 * 2 + uVar12 + 3];
              lVar9 = lVar9 + 2;
            }
            break;
          case 0x23:
            for (iVar7 = iVar3; -1 < iVar7; iVar7 = iVar7 + -1) {
              *pbVar8 = *pbVar10;
              pbVar8[1] = pbVar10[1];
              pbVar8[2] = pbVar10[2];
              pbVar10 = pbVar10 + 4;
              pbVar8 = pbVar8 + 3;
            }
          }
        }
        uVar12 = (ulong)((int)uVar12 + x * img_n);
        uVar5 = uVar5 + x * req_comp;
      }
      free(data);
      data = puVar4;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc(req_comp * x * y);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define COMBO(a,b)  ((a)*8+(b))
      #define CASE(a,b)   case COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (COMBO(img_n, req_comp)) {
         CASE(1,2) dest[0]=src[0], dest[1]=255; break;
         CASE(1,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(1,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=255; break;
         CASE(2,1) dest[0]=src[0]; break;
         CASE(2,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(2,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1]; break;
         CASE(3,4) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255; break;
         CASE(3,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(3,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255; break;
         CASE(4,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(4,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; break;
         CASE(4,3) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2]; break;
         default: STBI_ASSERT(0);
      }
      #undef CASE
   }

   STBI_FREE(data);
   return good;
}